

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

shared_ptr<OpticsParser::ProductGeometry> __thiscall
OpticsParser::parsePerforatedGeometry(OpticsParser *this,json *geometry_json)

{
  const_reference pvVar1;
  PerforatedGeometry *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  double spacingX;
  double spacingY;
  double dimensionX;
  double dimensionY;
  shared_ptr<OpticsParser::ProductGeometry> sVar2;
  string local_58;
  string perforationType;
  
  pvVar1 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           ::at<const_char_(&)[10],_0>(geometry_json,(char (*) [10])"spacing_x");
  spacingX = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             ::get_impl<double,_0>(pvVar1);
  pvVar1 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           ::at<const_char_(&)[10],_0>(geometry_json,(char (*) [10])"spacing_y");
  spacingY = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             ::get_impl<double,_0>(pvVar1);
  pvVar1 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           ::at<const_char_(&)[12],_0>(geometry_json,(char (*) [12])"dimension_x");
  dimensionX = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               ::get_impl<double,_0>(pvVar1);
  pvVar1 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           ::at<const_char_(&)[12],_0>(geometry_json,(char (*) [12])"dimension_y");
  dimensionY = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               ::get_impl<double,_0>(pvVar1);
  pvVar1 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           ::at<const_char_(&)[17],_0>(geometry_json,(char (*) [17])"perforation_type");
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&perforationType,pvVar1);
  this_00 = (PerforatedGeometry *)operator_new(0x48);
  std::__cxx11::string::string((string *)&local_58,&perforationType);
  PerforatedGeometry::PerforatedGeometry(this_00,spacingX,spacingY,dimensionX,dimensionY,&local_58);
  std::__shared_ptr<OpticsParser::ProductGeometry,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<OpticsParser::PerforatedGeometry,void>
            ((__shared_ptr<OpticsParser::ProductGeometry,(__gnu_cxx::_Lock_policy)2> *)this,this_00)
  ;
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&perforationType);
  sVar2.super___shared_ptr<OpticsParser::ProductGeometry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<OpticsParser::ProductGeometry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<OpticsParser::ProductGeometry>)
         sVar2.super___shared_ptr<OpticsParser::ProductGeometry,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ProductGeometry> parsePerforatedGeometry(nlohmann::json const & geometry_json)
    {
        double spacingX = geometry_json.at("spacing_x").get<double>();
        double spacingY = geometry_json.at("spacing_y").get<double>();
        double dimensionX = geometry_json.at("dimension_x").get<double>();
        double dimensionY = geometry_json.at("dimension_y").get<double>();
        std::string perforationType = geometry_json.at("perforation_type").get<std::string>();

        return std::shared_ptr<ProductGeometry>(
          new PerforatedGeometry(spacingX, spacingY, dimensionX, dimensionY, perforationType));
    }